

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
::remove_values(btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                *this,field_type i,field_type to_erase,allocator_type *alloc)

{
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  bVar1;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *pbVar2;
  uint uVar3;
  uint i_00;
  uint i_01;
  
  value_destroy_n(this,i,to_erase,alloc);
  if (((ulong)this & 7) == 0) {
    bVar1 = this[10];
    uVar3 = (uint)to_erase;
    i_00 = (uint)to_erase + (uint)i;
    transfer_n(this,(ulong)(byte)bVar1 - (ulong)(i_00 & 0xff),(ulong)i,(ulong)(i_00 & 0xff),this,
               alloc);
    if (this[0xb] ==
        (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
         )0x0) {
      if (to_erase != '\0') {
        i_01 = (uint)i;
        do {
          i_01 = i_01 + 1;
          pbVar2 = child(this,i_01);
          clear_and_delete(pbVar2,alloc);
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      if (i_00 < (byte)bVar1) {
        uVar3 = (uint)i;
        do {
          uVar3 = uVar3 + 1;
          i_00 = i_00 + 1;
          pbVar2 = child(this,i_00);
          set_child(this,uVar3,pbVar2);
          mutable_child(this,i_00);
        } while (i_00 < (byte)bVar1);
      }
    }
    this[10] = (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                )((char)bVar1 - to_erase);
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/layout.h"
                ,0x1e3,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
}

Assistant:

inline void btree_node<P>::remove_values(const field_type i,
                                         const field_type to_erase,
                                         allocator_type *alloc) {
  // Transfer values after the removed range into their new places.
  value_destroy_n(i, to_erase, alloc);
  const field_type orig_finish = finish();
  const field_type src_i = i + to_erase;
  transfer_n(orig_finish - src_i, i, src_i, this, alloc);

  if (is_internal()) {
    // Delete all children between begin and end.
    for (int j = 0; j < to_erase; ++j) {
      clear_and_delete(child(i + j + 1), alloc);
    }
    // Rotate children after end into new positions.
    for (int j = i + to_erase + 1; j <= orig_finish; ++j) {
      set_child(j - to_erase, child(j));
      clear_child(j);
    }
  }
  set_finish(orig_finish - to_erase);
}